

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O2

_Bool Curl_uint_bset_first(uint_bset *bset,uint *pfirst)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar1 = bset->nslots;
  iVar6 = 0;
  uVar4 = 0xffffffff;
  uVar5 = 0;
  while( true ) {
    if (uVar1 == uVar5) goto LAB_0015af48;
    uVar2 = bset->slots[uVar5];
    if (uVar2 != 0) break;
    uVar5 = uVar5 + 1;
    iVar6 = iVar6 + -0x40;
  }
  lVar3 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
    }
  }
  uVar4 = (int)lVar3 - iVar6;
LAB_0015af48:
  *pfirst = uVar4;
  return uVar5 < uVar1;
}

Assistant:

bool Curl_uint_bset_first(struct uint_bset *bset, unsigned int *pfirst)
{
  unsigned int i;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i]) {
      *pfirst = (i * 64) + CURL_CTZ64(bset->slots[i]);
      return TRUE;
    }
  }
  *pfirst = UINT_MAX; /* a value we cannot store */
  return FALSE;
}